

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_bcast_2phase(bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
                bsc_size_t n)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  void *dst;
  bool bVar4;
  int iVar5;
  bsp_pid_t bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bsc_pid_t bVar15;
  bsc_size_t block_remaining;
  int iVar16;
  int iVar17;
  int offset;
  ulong uVar18;
  bool bVar19;
  int local_9c;
  int local_98;
  int local_94;
  
  if (group == (bsc_group_t)0x0) {
    uVar7 = bsp_nprocs();
    uVar8 = bsp_pid();
  }
  else {
    uVar7 = *group;
    lVar2 = *(long *)((long)group + 8);
    bVar6 = bsp_pid();
    uVar8 = *(uint *)(lVar2 + (long)bVar6 * 4);
  }
  uVar11 = 0;
  uVar18 = (ulong)(uint)n;
  if (n < 1) {
    uVar18 = uVar11;
  }
  iVar14 = 0;
  for (; uVar18 * 0x30 - uVar11 != 0; uVar11 = uVar11 + 0x30) {
    iVar14 = iVar14 + *(int *)((long)&params->size + uVar11);
  }
  iVar9 = (int)(uVar7 + iVar14 + -1) / (int)uVar7;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  local_98 = -1;
  uVar18 = 0;
  iVar10 = 0;
  iVar13 = 0;
  local_9c = local_98;
  local_94 = local_98;
  while (iVar16 = iVar13, iVar17 = iVar10, uVar18 != uVar7) {
    iVar10 = iVar9 * (int)uVar18;
    if (iVar14 <= iVar10) {
      iVar10 = iVar14;
    }
    uVar11 = uVar18 + 1;
    iVar12 = (int)uVar11 * iVar9;
    if (iVar14 <= iVar12) {
      iVar12 = iVar14;
    }
    iVar12 = iVar12 - iVar10;
    offset = iVar17;
    iVar13 = iVar16;
    if (uVar18 == uVar8) {
      local_98 = iVar12;
    }
    do {
      iVar10 = iVar12 + offset;
      iVar1 = params[iVar13].size;
      bVar19 = iVar1 < iVar10;
      iVar5 = iVar1;
      if (iVar10 < iVar1) {
        iVar5 = iVar10;
      }
      if (iVar1 < iVar10) {
        iVar10 = 0;
      }
      pvVar3 = params[iVar13].src;
      dst = params[iVar13].dst;
      bVar6 = bsp_pid();
      if (bVar6 == root) {
        bVar15 = (int)uVar18;
        if (group != (bsc_group_t)0x0) {
          bVar15 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar18 * 4);
        }
        bsc_put(depends,bVar15,(void *)((long)pvVar3 + (long)offset),dst,offset,iVar5 - offset);
      }
      iVar13 = iVar13 + (uint)bVar19;
      iVar12 = (offset - iVar5) + iVar12;
      offset = iVar10;
    } while (0 < iVar12);
    bVar19 = uVar18 == uVar8;
    uVar18 = uVar11;
    if (bVar19) {
      local_9c = iVar16;
      local_94 = iVar17;
    }
  }
  for (uVar18 = 0; iVar14 = local_94, iVar9 = local_98, iVar10 = local_9c, uVar18 != uVar7;
      uVar18 = uVar18 + 1) {
    do {
      iVar13 = iVar9 + iVar14;
      iVar16 = params[iVar10].size;
      bVar19 = iVar16 < iVar13;
      iVar17 = iVar16;
      if (iVar13 < iVar16) {
        iVar17 = iVar13;
      }
      if (iVar16 < iVar13) {
        iVar13 = 0;
      }
      bVar15 = (bsc_pid_t)uVar18;
      if (group != (bsc_group_t)0x0) {
        bVar15 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar18 * 4);
      }
      iVar17 = iVar17 - iVar14;
      bsc_put(depends + 1,bVar15,(void *)((long)params[iVar10].dst + (long)iVar14),
              params[iVar10].dst,iVar14,iVar17);
      iVar16 = iVar9 - iVar17;
      bVar4 = iVar17 <= iVar9;
      iVar14 = iVar13;
      iVar9 = iVar16;
      iVar10 = iVar10 + (uint)bVar19;
    } while (iVar16 != 0 && bVar4);
  }
  return depends + 2;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_bcast_2phase( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n )
{
    const group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_pid_t s = g?g->lid[bsp_pid()]:bsp_pid();
    bsc_size_t i, total_size = 0;
    bsc_size_t block;
    bsc_size_t b, my_start_b=-1, my_block_size=-1;
    bsc_size_t j, my_start_j=-1;
    const char * src_bytes;
    char * dst_bytes;
 
    /* compute preferred block size */
    for ( i = 0 ; i < n; ++i )
        total_size += params[i].size;
    block = (total_size + P - 1)/P;
   
    /* the root scatters, all compute the block for the
     * following all-gather */
    b = 0; j = 0;
    for ( i = 0 ; i < P; ++i) {
        bsc_size_t block_begin = MIN(     i*block, total_size);
        bsc_size_t block_end   = MIN( (i+1)*block, total_size);
        bsc_size_t block_remaining = block_end - block_begin;

        if (i == s ) {
            my_start_j = j;
            my_start_b = b;
            my_block_size = block_remaining;
        }
        
        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            if (bsp_pid() == root ) 
                bsc_put( depends, g?g->gid[i]:i, 
                        src_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;

    }
    depends += 1;
    /* the all-gather */
    for ( i = 0; i < P; ++i ) {
        bsc_size_t block_remaining = my_block_size;
        b = my_start_b;
        j = my_start_j;

        do {
            bsc_size_t e = b + block_remaining;
            bsc_size_t next_b = e;
            bsc_size_t next_j = j;
            if (e > params[j].size) {
                e = params[j].size;
                next_j = j+1;
                next_b = 0;
            }
            src_bytes = params[j].src;
            dst_bytes = params[j].dst;
            bsc_put( depends, g?g->gid[i]:i, 
                    dst_bytes + b, dst_bytes, b, e - b);
            block_remaining -= (e-b);
            j = next_j;
            b = next_b;
        } while ( block_remaining > 0 ) ;
    }
    return depends+1;
}